

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong in_RCX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  uVar3 = CONCAT44(in_register_00000014,size);
  uVar6 = in_RCX & 0xffffffff;
  uVar5 = (uint)in_RCX;
  auVar10._8_8_ = unaff_RBX;
  auVar10._0_8_ = in_RAX;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar10);
  if ((int)uVar5 < iVar2) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0x49d,"invalid digit count");
  }
  if ((int)uVar5 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
                ,0x1b6,"negative value");
  }
  pcVar4 = out;
  uVar7 = uVar3;
  if ((out < (char *)0x64) <= uVar3) {
    do {
      uVar5 = (int)uVar6 - 2;
      uVar6 = (ulong)uVar5;
      auVar10 = __udivti3(pcVar4,uVar7,100,0);
      uVar3 = auVar10._8_8_;
      out = auVar10._0_8_;
      *(undefined2 *)(this + uVar6) =
           *(undefined2 *)(digits2(unsigned_long)::data + (long)(pcVar4 + (long)out * -100) * 2);
      bVar8 = (char *)0x270f < pcVar4;
      bVar9 = uVar7 != 0;
      uVar1 = -uVar7;
      pcVar4 = out;
      uVar7 = uVar3;
    } while (bVar9 || uVar1 < bVar8);
  }
  if (uVar3 < (out < (char *)0xa)) {
    uVar3 = (ulong)(uVar5 - 1);
    this[uVar3] = (detail)((byte)out | 0x30);
  }
  else {
    uVar3 = (ulong)(uVar5 - 2);
    *(undefined2 *)(this + uVar3) = *(undefined2 *)(digits2(unsigned_long)::data + (long)out * 2);
  }
  return (char *)(this + uVar3);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}